

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t element;
  intptr_t iVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  uVar1 = *(ulong *)(dictionary + 0x18);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  uVar5 = (ulong)(uint)((int)uVar4 * 2);
  sVar2 = 8;
  if (8 < uVar5) {
    sVar2 = uVar5;
  }
  sVar2 = sysbvm_array_create(context,sVar2);
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar2;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    if (sVar2 != 0) {
      element = sysbvm_association_getKey(sVar2);
      iVar3 = sysbvm_identityDictionary_scanFor(dictionary,element);
      if (iVar3 < 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:512: assertion failure: elementIndex >= 0"
                  );
      }
      *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + iVar3 * 8) = sVar2;
    }
  }
  return;
}

Assistant:

static void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t association = oldStorage->elements[i];
        if(association)
            sysbvm_identityDictionary_insertNoCheck(dictionary, association);
    }
}